

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler_test.cc
# Opt level: O0

void ADTestTest(int n)

{
  undefined1 auVar1 [16];
  uint n_00;
  ulong uVar2;
  double *__p;
  type pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  ostream *poVar6;
  double dVar7;
  double dVar8;
  string local_58;
  double local_38;
  double ad_stat;
  int local_1c;
  int i;
  unique_ptr<double[],_std::default_delete<double[]>_> random_sample;
  int n_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)n;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  random_sample._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl._4_4_ = n;
  __p = (double *)operator_new__(uVar2);
  std::unique_ptr<double[],std::default_delete<double[]>>::
  unique_ptr<double*,std::default_delete<double[]>,void,bool>
            ((unique_ptr<double[],std::default_delete<double[]>> *)&stack0xffffffffffffffe8,__p);
  for (local_1c = 0;
      local_1c <
      (int)random_sample._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
           super__Head_base<0UL,_double_*,_false>._M_head_impl._4_4_; local_1c = local_1c + 1) {
    dVar7 = (double)local_1c;
    dVar8 = (double)(int)random_sample._M_t.
                         super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                         super__Head_base<0UL,_double_*,_false>._M_head_impl._4_4_;
    pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                       ((unique_ptr<double[],_std::default_delete<double[]>_> *)
                        &stack0xffffffffffffffe8,(long)local_1c);
    *pdVar3 = (dVar7 + 0.01) / dVar8;
  }
  pdVar4 = std::unique_ptr<double[],_std::default_delete<double[]>_>::get
                     ((unique_ptr<double[],_std::default_delete<double[]>_> *)
                      &stack0xffffffffffffffe8);
  pdVar5 = std::unique_ptr<double[],_std::default_delete<double[]>_>::get
                     ((unique_ptr<double[],_std::default_delete<double[]>_> *)
                      &stack0xffffffffffffffe8);
  std::sort<double*>(pdVar4,pdVar5 + (int)random_sample._M_t.
                                          super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                          .super__Head_base<0UL,_double_*,_false>._M_head_impl._4_4_
                    );
  n_00 = random_sample._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
         super__Head_base<0UL,_double_*,_false>._M_head_impl._4_4_;
  pdVar4 = std::unique_ptr<double[],_std::default_delete<double[]>_>::get
                     ((unique_ptr<double[],_std::default_delete<double[]>_> *)
                      &stack0xffffffffffffffe8);
  local_38 = AndersonDarlingStatistic(n_00,pdVar4);
  poVar6 = std::operator<<((ostream *)&std::cerr,"\n");
  StringPrintf_abi_cxx11_
            (&local_58,"Testing the AD test. n=%d, ad_stat = %f",local_38,
             (ulong)random_sample._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                    ._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                    super__Head_base<0UL,_double_*,_false>._M_head_impl._4_4_);
  std::operator<<(poVar6,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

void ADTestTest(int n) {
  std::unique_ptr<double[]> random_sample(new double[n]);
  for (int i = 0; i < n; i++) {
    random_sample[i] = (i+0.01)/n;
  }
  std::sort(random_sample.get(), random_sample.get() + n);
  double ad_stat = AndersonDarlingStatistic(n, random_sample.get());
  LOG(INFO) << StringPrintf("Testing the AD test. n=%d, ad_stat = %f",
                            n, ad_stat);
}